

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O3

boolean encode_mcu_DC_first(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  jpeg_entropy_encoder *pjVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  _func_boolean_j_compress_ptr_JBLOCKROW_ptr *p_Var9;
  uint uVar10;
  long lVar11;
  long lVar12;
  undefined4 local_5c;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    uVar10 = *(uint *)&pjVar2[4].start_pass;
    if (uVar10 == 0) {
      emit_restart(cinfo,*(int *)((long)&pjVar2[4].start_pass + 4));
      uVar10 = cinfo->restart_interval;
      *(uint *)((long)&pjVar2[4].start_pass + 4) =
           *(int *)((long)&pjVar2[4].start_pass + 4) + 1U & 7;
    }
    *(uint *)&pjVar2[4].start_pass = uVar10 - 1;
  }
  if (0 < cinfo->blocks_in_MCU) {
    lVar5 = 0;
    do {
      lVar11 = (long)cinfo->MCU_membership[lVar5];
      iVar4 = (int)(*MCU_data[lVar5])[0] >> ((byte)cinfo->Al & 0x1f);
      iVar1 = cinfo->cur_comp_info[lVar11]->dc_tbl_no;
      p_Var9 = (&pjVar2[4].encode_mcu)[iVar1] + *(int *)((long)&pjVar2[3].encode_mcu + lVar11 * 4);
      iVar6 = iVar4 - *(int *)((long)&pjVar2[2].finish_pass + lVar11 * 4);
      if (iVar6 == 0) {
        arith_encode(cinfo,(uchar *)p_Var9,0);
        *(undefined4 *)((long)&pjVar2[3].encode_mcu + lVar11 * 4) = 0;
      }
      else {
        *(int *)((long)&pjVar2[2].finish_pass + lVar11 * 4) = iVar4;
        arith_encode(cinfo,(uchar *)p_Var9,1);
        uVar10 = 0;
        bVar3 = iVar6 < 1;
        if (bVar3) {
          iVar6 = -iVar6;
          local_5c = 8;
          lVar12 = 3;
        }
        else {
          local_5c = 4;
          lVar12 = 2;
        }
        arith_encode(cinfo,(uchar *)(p_Var9 + 1),(uint)bVar3);
        p_Var9 = p_Var9 + lVar12;
        *(undefined4 *)((long)&pjVar2[3].encode_mcu + lVar11 * 4) = local_5c;
        uVar7 = iVar6 - 1;
        if (uVar7 != 0) {
          uVar10 = 1;
          arith_encode(cinfo,(uchar *)p_Var9,1);
          p_Var9 = (&pjVar2[4].encode_mcu)[iVar1] + 0x14;
          if (uVar7 != 1) {
            uVar10 = 1;
            uVar8 = uVar7;
            do {
              arith_encode(cinfo,(uchar *)p_Var9,1);
              uVar10 = uVar10 * 2;
              p_Var9 = p_Var9 + 1;
              bVar3 = 3 < uVar8;
              uVar8 = uVar8 >> 1;
            } while (bVar3);
          }
        }
        iVar4 = 0;
        arith_encode(cinfo,(uchar *)p_Var9,0);
        if ((int)uVar10 < (int)((ulong)(1L << (cinfo->arith_dc_L[iVar1] & 0x3f)) >> 1)) {
LAB_00133ee9:
          *(int *)((long)&pjVar2[3].encode_mcu + lVar11 * 4) = iVar4;
        }
        else if ((int)((ulong)(1L << (cinfo->arith_dc_U[iVar1] & 0x3f)) >> 1) < (int)uVar10) {
          iVar4 = *(int *)((long)&pjVar2[3].encode_mcu + lVar11 * 4) + 8;
          goto LAB_00133ee9;
        }
        if (1 < uVar10) {
          do {
            uVar10 = (int)uVar10 >> 1;
            arith_encode(cinfo,(uchar *)(p_Var9 + 0xe),(uint)((uVar10 & uVar7) != 0));
          } while (1 < uVar10);
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < cinfo->blocks_in_MCU);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_DC_first(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;
  register int temp, temp2, temp3;
  register int nbits;
  int blkn, ci;
  int Al = cinfo->Al;
  JBLOCKROW block;
  jpeg_component_info *compptr;
  ISHIFT_TEMPS

  entropy->next_output_byte = cinfo->dest->next_output_byte;
  entropy->free_in_buffer = cinfo->dest->free_in_buffer;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval)
    if (entropy->restarts_to_go == 0)
      emit_restart(entropy, entropy->next_restart_num);

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];

    /* Compute the DC value after the required point transform by Al.
     * This is simply an arithmetic right shift.
     */
    temp2 = IRIGHT_SHIFT((int)((*block)[0]), Al);

    /* DC differences are figured on the point-transformed values. */
    temp = temp2 - entropy->last_dc_val[ci];
    entropy->last_dc_val[ci] = temp2;

    /* Encode the DC coefficient difference per section G.1.2.1 */

    /* This is a well-known technique for obtaining the absolute value without
     * a branch.  It is derived from an assembly language technique presented
     * in "How to Optimize for the Pentium Processors", Copyright (c) 1996,
     * 1997 by Agner Fog.
     */
    temp3 = temp >> (CHAR_BIT * sizeof(int) - 1);
    temp ^= temp3;
    temp -= temp3;              /* temp is abs value of input */
    /* For a negative input, want temp2 = bitwise complement of abs(input) */
    temp2 = temp ^ temp3;

    /* Find the number of bits needed for the magnitude of the coefficient */
    nbits = JPEG_NBITS(temp);
    /* Check for out-of-range coefficient values.
     * Since we're encoding a difference, the range limit is twice as much.
     */
    if (nbits > MAX_COEF_BITS + 1)
      ERREXIT(cinfo, JERR_BAD_DCT_COEF);

    /* Count/emit the Huffman-coded symbol for the number of bits */
    emit_symbol(entropy, compptr->dc_tbl_no, nbits);

    /* Emit that number of bits of the value, if positive, */
    /* or the complement of its magnitude, if negative. */
    if (nbits)                  /* emit_bits rejects calls with size 0 */
      emit_bits(entropy, (unsigned int)temp2, nbits);
  }

  cinfo->dest->next_output_byte = entropy->next_output_byte;
  cinfo->dest->free_in_buffer = entropy->free_in_buffer;

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}